

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<std::__cxx11::string,char[35],unsigned_long>
          (string *__return_storage_ptr__,Diligent *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args,
          char (*Args_1) [35],unsigned_long *Args_2)

{
  stringstream local_1b0 [8];
  stringstream ss;
  unsigned_long *Args_local_2;
  char (*Args_local_1) [35];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[35],unsigned_long>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [35])Args,(unsigned_long *)Args_1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}